

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TSS_SequenceComplete
                 (TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT sequenceHandle,BYTE *data,
                 UINT32 dataSize,TPM2B_DIGEST *result)

{
  TPM_RC TVar1;
  TPM2B_MAX_BUFFER dataBuf;
  TPM2B_MAX_BUFFER local_422;
  
  local_422.t.size = (UINT16)dataSize;
  TVar1 = 0x95;
  if (dataSize < 0x401) {
    MemoryCopy(local_422.t.buffer,data,dataSize);
    TVar1 = TPM2_SequenceComplete
                      (tpm,session,sequenceHandle,&local_422,0x40000007,result,
                       (TPMT_TK_HASHCHECK *)0x0);
  }
  return TVar1;
}

Assistant:

TPM_RC
TSS_SequenceComplete(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          sequenceHandle,     // IN
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPM2B_DIGEST           *result              // OUT
)
{
    TPM2B_MAX_BUFFER    dataBuf;// = { (UINT16)dataSize };
    dataBuf.t.size = (UINT16)dataSize;

    if (dataSize > MAX_DIGEST_BUFFER)
        return TPM_RC_SIZE;
    MemoryCopy(dataBuf.t.buffer, data, dataSize);

    return TPM2_SequenceComplete(tpm, session, sequenceHandle, &dataBuf, TPM_RH_NULL,
        result, NULL);
}